

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParserImpl
          (ParserImpl *this,Descriptor *root_message_type,ZeroCopyInputStream *input_stream,
          ErrorCollector *error_collector,Finder *finder,ParseInfoTree *parse_info_tree,
          SingularOverwritePolicy singular_overwrite_policy,bool allow_case_insensitive_field,
          bool allow_unknown_field,bool allow_unknown_extension,bool allow_unknown_enum,
          bool allow_field_number,bool allow_relaxed_whitespace,bool allow_partial,
          int recursion_limit)

{
  byte bVar1;
  undefined1 in_CL;
  byte bVar2;
  undefined7 in_register_00000009;
  byte bVar3;
  byte bVar4;
  Descriptor *in_RSI;
  byte bVar5;
  ParserImpl *in_RDI;
  undefined1 in_R8B;
  byte bVar6;
  undefined7 in_register_00000081;
  undefined1 in_R9B;
  byte bVar7;
  undefined7 in_register_00000089;
  SingularOverwritePolicy in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  ErrorCollector *in_stack_ffffffffffffff90;
  ZeroCopyInputStream *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  
  bVar7 = in_stack_00000010 & 1;
  bVar6 = in_stack_00000018 & 1;
  bVar5 = in_stack_00000020 & 1;
  bVar4 = in_stack_00000028 & 1;
  bVar3 = (byte)parse_info_tree & 1;
  bVar2 = (byte)finder & 1;
  bVar1 = (byte)error_collector & 1;
  in_RDI->error_collector_ = (ErrorCollector *)CONCAT71(in_register_00000009,in_CL);
  in_RDI->finder_ = (Finder *)CONCAT71(in_register_00000081,in_R8B);
  in_RDI->parse_info_tree_ = (ParseInfoTree *)CONCAT71(in_register_00000089,in_R9B);
  ParserErrorCollector::ParserErrorCollector(&in_RDI->tokenizer_error_collector_,in_RDI);
  io::Tokenizer::Tokenizer
            ((Tokenizer *)
             CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(bVar4,CONCAT13(bVar3,CONCAT12(
                                                  bVar2,CONCAT11(bVar1,in_stack_ffffffffffffffa0))))
                                                  ))),in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  in_RDI->root_message_type_ = in_RSI;
  in_RDI->singular_overwrite_policy_ = in_stack_00000008;
  in_RDI->allow_case_insensitive_field_ = (bool)(bVar7 & 1);
  in_RDI->allow_unknown_field_ = (bool)(bVar6 & 1);
  in_RDI->allow_unknown_extension_ = (bool)(bVar5 & 1);
  in_RDI->allow_unknown_enum_ = (bool)(bVar4 & 1);
  in_RDI->allow_field_number_ = (bool)(bVar3 & 1);
  in_RDI->allow_partial_ = (bool)(bVar1 & 1);
  in_RDI->recursion_limit_ = (int)input_stream;
  in_RDI->had_errors_ = false;
  io::Tokenizer::set_allow_f_after_float(&in_RDI->tokenizer_,true);
  io::Tokenizer::set_comment_style(&in_RDI->tokenizer_,SH_COMMENT_STYLE);
  if ((bVar2 & 1) != 0) {
    io::Tokenizer::set_require_space_after_number(&in_RDI->tokenizer_,false);
    io::Tokenizer::set_allow_multiline_strings(&in_RDI->tokenizer_,true);
  }
  io::Tokenizer::Next((Tokenizer *)input_stream);
  return;
}

Assistant:

ParserImpl(const Descriptor* root_message_type,
             io::ZeroCopyInputStream* input_stream,
             io::ErrorCollector* error_collector,
             const TextFormat::Finder* finder, ParseInfoTree* parse_info_tree,
             SingularOverwritePolicy singular_overwrite_policy,
             bool allow_case_insensitive_field, bool allow_unknown_field,
             bool allow_unknown_extension, bool allow_unknown_enum,
             bool allow_field_number, bool allow_relaxed_whitespace,
             bool allow_partial, int recursion_limit)
      : error_collector_(error_collector),
        finder_(finder),
        parse_info_tree_(parse_info_tree),
        tokenizer_error_collector_(this),
        tokenizer_(input_stream, &tokenizer_error_collector_),
        root_message_type_(root_message_type),
        singular_overwrite_policy_(singular_overwrite_policy),
        allow_case_insensitive_field_(allow_case_insensitive_field),
        allow_unknown_field_(allow_unknown_field),
        allow_unknown_extension_(allow_unknown_extension),
        allow_unknown_enum_(allow_unknown_enum),
        allow_field_number_(allow_field_number),
        allow_partial_(allow_partial),
        recursion_limit_(recursion_limit),
        had_errors_(false) {
    // For backwards-compatibility with proto1, we need to allow the 'f' suffix
    // for floats.
    tokenizer_.set_allow_f_after_float(true);

    // '#' starts a comment.
    tokenizer_.set_comment_style(io::Tokenizer::SH_COMMENT_STYLE);

    if (allow_relaxed_whitespace) {
      tokenizer_.set_require_space_after_number(false);
      tokenizer_.set_allow_multiline_strings(true);
    }

    // Consume the starting token.
    tokenizer_.Next();
  }